

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Kinematics.cc
# Opt level: O3

bool RigidBodyDynamics::InverseKinematics
               (Model *model,VectorNd *Qinit,
               vector<unsigned_int,_std::allocator<unsigned_int>_> *body_id,
               vector<Vector3_t,_std::allocator<Vector3_t>_> *body_point,
               vector<Vector3_t,_std::allocator<Vector3_t>_> *target_pos,VectorNd *Qres,
               double step_tol,double lambda,uint max_iter)

{
  size_t __size;
  double *pdVar1;
  double *pdVar2;
  pointer pVVar3;
  pointer puVar4;
  pointer puVar5;
  int iVar6;
  Index IVar7;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *pPVar8;
  Model *model_00;
  ulong uVar9;
  LhsNested pMVar10;
  ulong uVar11;
  double *pdVar12;
  void *__ptr;
  undefined8 *puVar13;
  ulong uVar14;
  long lVar15;
  ActualDstType actualDst_1;
  uint uVar16;
  Index othersize;
  Index *pIVar17;
  ulong uVar18;
  Index **ppIVar19;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar20;
  vector<Vector3_t,_std::allocator<Vector3_t>_> *pvVar21;
  undefined1 auVar22 [8];
  ActualDstType actualDst;
  double dVar23;
  Scalar SVar24;
  VectorNd test_delta;
  VectorNd e;
  MatrixNd J;
  VectorNd z;
  MatrixNd G;
  Vector3d point_base;
  MatrixNd JJTe_lambda2_I;
  DenseStorage<double,__1,__1,_1,_0> local_218;
  scalar_sum_op<double,_double> local_1f9;
  Matrix<double,__1,_1,_0,__1,_1> local_1f8;
  DenseStorage<double,__1,__1,_1,_0> local_1e8;
  DenseStorage<double,__1,__1,_1,_0> local_1d8;
  Matrix<double,__1,__1,_0,__1,__1> local_1c0;
  Matrix<double,__1,_1,_0,__1,_1> local_1a8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_190;
  vector<Vector3_t,_std::allocator<Vector3_t>_> *local_188;
  ulong local_180;
  double local_178;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *local_170;
  Model *local_168;
  ulong local_160;
  undefined1 local_158 [8];
  evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_> eStack_150;
  variable_if_dynamic<long,__1> local_148;
  XprTypeNested local_140;
  variable_if_dynamic<long,__1> local_138;
  scalar_constant_op<double> sStack_130;
  variable_if_dynamic<long,__1> local_128;
  variable_if_dynamic<long,__1> local_120;
  variable_if_dynamic<long,__1> local_118;
  Matrix<double,__1,_1,_0,__1,_1> *local_108;
  variable_if_dynamic<long,__1> local_100;
  ulong local_f0;
  ulong local_d8;
  double local_d0;
  Scalar local_c8;
  redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_true>_>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_true>_>_>
  local_c0;
  DenseStorage<double,__1,__1,__1,_0> local_88;
  vector<Vector3_t,_std::allocator<Vector3_t>_> *local_68;
  ulong local_60;
  DenseStorage<double,__1,__1,_1,_0> local_58;
  DenseStorage<double,__1,__1,__1,_0> local_48;
  
  local_158 = (undefined1  [8])
              (((long)(body_id->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)(body_id->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                      _M_impl.super__Vector_impl_data._M_start >> 2) * 3);
  eStack_150.m_d.data._4_4_ = 0;
  eStack_150.m_d.data._0_4_ = model->qdot_size;
  local_148.m_value = 0;
  local_188 = body_point;
  local_178 = lambda;
  local_168 = model;
  local_d0 = step_tol;
  local_68 = target_pos;
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_1c0,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
              *)local_158);
  pMVar10 = (LhsNested)
            (((long)(body_id->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(body_id->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                    _M_impl.super__Vector_impl_data._M_start >> 2) * 3);
  local_1d8.m_data = (double *)0x0;
  local_1d8.m_rows = 0;
  local_190 = body_id;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_1d8,(Index)pMVar10,1
            );
  if ((LhsNested)local_1d8.m_rows != pMVar10) {
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
              ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_1d8,(Index)pMVar10
               ,1);
    pMVar10 = (LhsNested)local_1d8.m_rows;
  }
  if (0 < (long)pMVar10) {
    memset(local_1d8.m_data,0,(long)pMVar10 << 3);
  }
  pdVar1 = (Qinit->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
  uVar11 = (Qinit->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
  if ((Qres->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows !=
      uVar11) {
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
              (&Qres->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,uVar11,1);
    uVar11 = (Qres->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows
    ;
  }
  pdVar2 = (Qres->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
  uVar14 = uVar11 - ((long)uVar11 >> 0x3f) & 0xfffffffffffffffe;
  if (1 < (long)uVar11) {
    lVar15 = 0;
    do {
      pdVar12 = pdVar1 + lVar15;
      dVar23 = pdVar12[1];
      pdVar2[lVar15] = *pdVar12;
      (pdVar2 + lVar15)[1] = dVar23;
      lVar15 = lVar15 + 2;
    } while (lVar15 < (long)uVar14);
  }
  if ((long)uVar14 < (long)uVar11) {
    do {
      pdVar2[uVar14] = pdVar1[uVar14];
      uVar14 = uVar14 + 1;
    } while (uVar11 != uVar14);
  }
  local_d8 = 0;
  local_170 = &Qres->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>;
  if (max_iter == 0) {
    local_180 = 0;
  }
  else {
    local_178 = local_178 * local_178;
    local_180 = CONCAT71((int7)((ulong)pdVar2 >> 8),1);
    pvVar20 = local_190;
    do {
      pvVar21 = local_188;
      UpdateKinematicsCustom(local_168,(VectorNd *)local_170,(VectorNd *)0x0,(VectorNd *)0x0);
      if ((pvVar20->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
          super__Vector_impl_data._M_finish !=
          (pvVar20->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
          super__Vector_impl_data._M_start) {
        local_160 = 0;
        uVar11 = 0;
        do {
          local_158 = (undefined1  [8])0x0;
          eStack_150.m_d.data = (plainobjectbase_evaluator_data<double,_0>)(double *)0x0;
          local_148.m_value = 0;
          Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
                    ((DenseStorage<double,__1,__1,__1,_0> *)local_158,
                     (ulong)local_168->qdot_size * 3,3,(ulong)local_168->qdot_size);
          local_60 = uVar11;
          if (0 < (long)eStack_150.m_d.data * local_148.m_value) {
            memset((void *)local_158,0,(long)eStack_150.m_d.data * local_148.m_value * 8);
          }
          model_00 = local_168;
          pPVar8 = local_170;
          CalcPointJacobian(local_168,(VectorNd *)local_170,
                            (pvVar20->
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
                            .super__Vector_impl_data._M_start[uVar11],
                            (pvVar21->super__Vector_base<Vector3_t,_std::allocator<Vector3_t>_>).
                            _M_impl.super__Vector_impl_data._M_start + uVar11,(MatrixNd *)local_158,
                            false);
          CalcBodyToBaseCoordinates
                    ((Vector3d *)&local_c0,model_00,(VectorNd *)pPVar8,
                     (pvVar20->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                     _M_impl.super__Vector_impl_data._M_start[uVar11],
                     (pvVar21->super__Vector_base<Vector3_t,_std::allocator<Vector3_t>_>)._M_impl.
                     super__Vector_impl_data._M_start + uVar11,false);
          uVar18 = (ulong)model_00->qdot_size;
          pVVar3 = (local_68->super__Vector_base<Vector3_t,_std::allocator<Vector3_t>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          iVar6 = (int)local_60;
          uVar14 = local_160 & 0xffffffff;
          lVar15 = 0;
          auVar22 = local_158;
          do {
            if (uVar18 != 0) {
              ppIVar19 = (Index **)
                         ((long)local_1c0.
                                super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                                m_storage.m_data + uVar14 * 8);
              uVar9 = uVar18;
              pIVar17 = (Index *)auVar22;
              do {
                *ppIVar19 = *(Index **)
                             &((LhsNested)pIVar17)->
                              super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>;
                pIVar17 = (Index *)((long)&((LhsNested)pIVar17)->
                                           super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                                   + (long)eStack_150.m_d.data * 8);
                ppIVar19 = ppIVar19 +
                           local_1c0.
                           super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                           m_storage.m_rows;
                uVar9 = uVar9 - 1;
              } while (uVar9 != 0);
            }
            local_1d8.m_data[(uint)(iVar6 * 3 + (int)lVar15)] =
                 (double)(*(double *)
                           ((long)&pVVar3[uVar11].super_Vector3d.
                                   super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                                   m_storage + lVar15 * 8) -
                         *(double *)
                          (&local_c0.
                            super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_true>_>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_true>_>_>
                            .
                            super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_true>_>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_true>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
                            .m_d.field_0x0 + lVar15 * 8));
            lVar15 = lVar15 + 1;
            auVar22 = (undefined1  [8])((long)auVar22 + 8);
            uVar14 = (ulong)((int)uVar14 + 1);
          } while (lVar15 != 3);
          free((void *)local_158);
          uVar11 = (ulong)(iVar6 + 1);
          local_160 = (ulong)((int)local_160 + 3);
          pvVar20 = local_190;
          pvVar21 = local_188;
        } while (uVar11 < (ulong)((long)(local_190->
                                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                        )._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(local_190->
                                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                        )._M_impl.super__Vector_impl_data._M_start >> 2));
      }
      local_c0.
      super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_true>_>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_true>_>_>
      .
      super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_true>_>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_true>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
      .m_d._0_8_ = &local_1d8;
      if ((LhsNested)local_1d8.m_rows == (LhsNested)0x0) {
        dVar23 = 0.0;
      }
      else {
        eStack_150.m_d.data =
             (plainobjectbase_evaluator_data<double,_0>)
             (plainobjectbase_evaluator_data<double,_0>)local_1d8.m_data;
        dVar23 = Eigen::internal::
                 redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::Matrix<double,-1,1,0,-1,1>const>>,3,0>
                 ::
                 run<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>>
                           ((redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                             *)local_158,(scalar_sum_op<double,_double> *)&local_88,
                            (CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                             *)&local_c0);
      }
      if (SQRT(dVar23) < local_d0) break;
      local_140.m_matrix = (non_const_type)local_1d8.m_rows;
      local_138.m_value = local_1d8.m_rows;
      sStack_130.m_other = local_178;
      local_128.m_value = local_1d8.m_rows;
      local_120.m_value = local_1d8.m_rows;
      local_88.m_data = (double *)0x0;
      local_88.m_rows = 0;
      local_88.m_cols = 0;
      local_158 = (undefined1  [8])&local_1c0;
      eStack_150.m_d.data =
           (plainobjectbase_evaluator_data<double,_0>)
           (plainobjectbase_evaluator_data<double,_0>)&local_1c0;
      if (((LhsNested)local_1d8.m_rows != (LhsNested)0x0) &&
         (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff)) / SEXT816(local_1d8.m_rows),0) <
          local_1d8.m_rows)) {
        puVar13 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar13 = operator_new;
        __cxa_throw(puVar13,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
      }
      Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
                (&local_88,local_1d8.m_rows * local_1d8.m_rows,local_1d8.m_rows,local_1d8.m_rows);
      Eigen::internal::
      call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>,0>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>const>const>,Eigen::internal::assign_op<double,double>>
                ((Matrix<double,__1,__1,_0,__1,__1> *)&local_88,
                 (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_0>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>
                  *)local_158,(assign_op<double,_double> *)&local_c0);
      puVar4 = (pvVar20->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      puVar5 = (pvVar20->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      lVar15 = (long)puVar4 - (long)puVar5 >> 2;
      local_1a8.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
           (double *)0x0;
      local_1a8.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
      pMVar10 = (LhsNested)
                local_1a8.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                m_data;
      if (puVar4 != puVar5) {
        if (lVar15 < 1) {
          pMVar10 = (LhsNested)0x0;
        }
        else if ((0x1fffffffffffffff < (ulong)(lVar15 * 3)) ||
                (pMVar10 = (LhsNested)malloc(lVar15 * 0x18), pMVar10 == (LhsNested)0x0)) {
          puVar13 = (undefined8 *)__cxa_allocate_exception(8);
          *puVar13 = operator_new;
          __cxa_throw(puVar13,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
        }
      }
      local_1a8.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
           (double *)pMVar10;
      local_1a8.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
           lVar15 * 3;
      Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::DenseStorage(&local_48,&local_88);
      Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage(&local_58,&local_1d8);
      Math::LinSolveGaussElimPivot((MatrixNd *)&local_48,(VectorNd *)&local_58,&local_1a8);
      free(local_58.m_data);
      free(local_48.m_data);
      local_218.m_data = (double *)0x0;
      local_218.m_rows = 0;
      Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_218,
                 local_1c0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 m_storage.m_cols,1);
      uVar11 = local_1c0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
               m_cols;
      if (local_218.m_rows !=
          local_1c0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
          m_cols) {
        Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                  ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_218,
                   local_1c0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                   m_storage.m_cols,1);
        uVar11 = local_218.m_rows;
      }
      if (0 < (long)uVar11) {
        memset(local_218.m_data,0,uVar11 << 3);
      }
      local_1f8.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
           (double *)0x3ff0000000000000;
      if (local_1c0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
          m_cols == 1) {
        local_158 = (undefined1  [8])
                    local_1c0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                    m_storage.m_data;
        local_148.m_value =
             local_1c0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
             m_rows;
        local_138.m_value = 0;
        sStack_130.m_other = 0.0;
        local_128.m_value =
             local_1c0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
             m_rows;
        local_120.m_value =
             (long)local_1a8.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                   m_storage.m_data;
        local_118.m_value =
             local_1a8.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
             m_rows;
        local_100.m_value = 0;
        local_f0 = local_1a8.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                   m_storage.m_rows;
        local_140.m_matrix = &local_1c0;
        local_108 = &local_1a8;
        if (local_1a8.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
            m_rows == 0) {
          dVar23 = 0.0;
        }
        else {
          local_c0.
          super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_true>_>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_true>_>_>
          .
          super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_true>_>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_true>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
          .m_d.lhsImpl.
          super_evaluator<Eigen::Transpose<const_Eigen::Block<const_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_true>_>_>
          .
          super_unary_evaluator<Eigen::Transpose<const_Eigen::Block<const_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_true>_>,_Eigen::internal::IndexBased,_double>
          .m_argImpl.
          super_evaluator<Eigen::Block<const_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_true>_>
          .
          super_block_evaluator<const_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_true,_true>
          .
          super_mapbase_evaluator<Eigen::Block<const_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_true>,_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>
          .m_data = local_1c0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                    m_storage.m_data;
          local_c0.
          super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_true>_>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_true>_>_>
          .
          super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_true>_>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_true>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
          .m_d.lhsImpl.
          super_evaluator<Eigen::Transpose<const_Eigen::Block<const_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_true>_>_>
          .
          super_unary_evaluator<Eigen::Transpose<const_Eigen::Block<const_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_true>_>,_Eigen::internal::IndexBased,_double>
          .m_argImpl.
          super_evaluator<Eigen::Block<const_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_true>_>
          .
          super_block_evaluator<const_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_true,_true>
          .
          super_mapbase_evaluator<Eigen::Block<const_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_true>,_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>
          .m_outerStride.m_value =
               local_1c0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
               m_rows;
          local_c0.
          super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_true>_>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_true>_>_>
          .
          super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_true>_>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_true>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
          .m_d.rhsImpl.
          super_evaluator<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_true>_>.
          super_block_evaluator<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_true,_true>.
          super_mapbase_evaluator<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_true>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
          .m_data = local_1a8.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                    m_storage.m_data;
          local_c0.
          super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_true>_>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_true>_>_>
          .
          super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_true>_>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_true>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
          .m_d.rhsImpl.
          super_evaluator<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_true>_>.
          super_block_evaluator<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_true,_true>.
          super_mapbase_evaluator<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_true>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
          .m_outerStride.m_value =
               local_1a8.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
               m_rows;
          dVar23 = Eigen::internal::
                   redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,double>,Eigen::Transpose<Eigen::Block<Eigen::Transpose<Eigen::Matrix<double,-1,-1,0,-1,-1>>const,1,-1,true>const>const,Eigen::Block<Eigen::Matrix<double,-1,1,0,-1,1>const,-1,1,true>const>>,3,0>
                   ::
                   run<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,double>,Eigen::Transpose<Eigen::Block<Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>const,1,_1,true>const>const,Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,_1,1,true>const>>
                             (&local_c0,(scalar_sum_op<double,_double> *)&local_1e8,
                              (CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_true>_>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_true>_>
                               *)local_158);
        }
        *local_218.m_data = (double)(dVar23 + (double)*local_218.m_data);
      }
      else {
        local_158 = (undefined1  [8])&local_1c0;
        Eigen::internal::gemv_dense_selector<2,1,true>::
        run<Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>,Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Matrix<double,_1,1,0,_1,1>>
                  ((Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_158,&local_1a8,
                   (Matrix<double,__1,_1,_0,__1,_1> *)&local_218,(Scalar *)&local_1f8);
      }
      pPVar8 = local_170;
      pdVar2 = local_218.m_data;
      pdVar1 = (local_170->m_storage).m_data;
      pdVar12 = pdVar1;
      uVar11 = local_218.m_rows;
      if ((local_170->m_storage).m_rows != local_218.m_rows) {
        Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                  (local_170,local_218.m_rows,1);
        pdVar12 = (pPVar8->m_storage).m_data;
        uVar11 = (pPVar8->m_storage).m_rows;
      }
      uVar14 = uVar11 - ((long)uVar11 >> 0x3f) & 0xfffffffffffffffe;
      if (1 < (long)uVar11) {
        lVar15 = 0;
        do {
          dVar23 = (pdVar1 + lVar15)[1];
          ppIVar19 = (Index **)(pdVar2 + lVar15);
          pIVar17 = ppIVar19[1];
          pdVar12[lVar15] = pdVar1[lVar15] + (double)*ppIVar19;
          (pdVar12 + lVar15)[1] = dVar23 + (double)pIVar17;
          lVar15 = lVar15 + 2;
        } while (lVar15 < (long)uVar14);
      }
      if ((long)uVar14 < (long)uVar11) {
        do {
          pdVar12[uVar14] = pdVar1[uVar14] + (double)pdVar2[uVar14];
          uVar14 = uVar14 + 1;
        } while (uVar11 != uVar14);
      }
      if (local_218.m_rows == 0) {
        dVar23 = 0.0;
        local_c0.
        super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_true>_>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_true>_>_>
        .
        super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_true>_>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_true>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
        .m_d._0_8_ = &local_218;
      }
      else {
        eStack_150.m_d.data =
             (plainobjectbase_evaluator_data<double,_0>)
             (plainobjectbase_evaluator_data<double,_0>)local_218.m_data;
        local_c0.
        super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_true>_>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_true>_>_>
        .
        super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_true>_>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_true>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
        .m_d._0_8_ = &local_218;
        dVar23 = Eigen::internal::
                 redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::Matrix<double,-1,1,0,-1,1>const>>,3,0>
                 ::
                 run<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>>
                           ((redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                             *)local_158,(scalar_sum_op<double,_double> *)&local_1f8,
                            (CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                             *)&local_c0);
      }
      IVar7 = local_1a8.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
              m_rows;
      if (SQRT(dVar23) < local_d0) {
        free(local_218.m_data);
        free(local_1a8.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
             m_data);
        free(local_88.m_data);
        break;
      }
      local_1f8.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
           (double *)0x0;
      local_1f8.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
      if (local_1a8.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
          == 0) {
LAB_00185cc3:
        __ptr = (void *)0x0;
      }
      else {
        if (local_1a8.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
            m_rows < 1) {
          local_1f8.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
               = local_1a8.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                 m_rows;
          goto LAB_00185cc3;
        }
        if (0x1fffffffffffffff <
            (ulong)local_1a8.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                   m_storage.m_rows) {
LAB_00185db9:
          puVar13 = (undefined8 *)__cxa_allocate_exception(8);
          *puVar13 = operator_new;
          __cxa_throw(puVar13,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
        }
        __size = local_1a8.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                 m_rows * 8;
        pMVar10 = (LhsNested)malloc(__size);
        if (pMVar10 == (LhsNested)0x0) goto LAB_00185db9;
        local_1f8.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
             IVar7;
        local_1f8.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
             (double *)pMVar10;
        __ptr = malloc(__size);
        if (__ptr == (void *)0x0) {
          puVar13 = (undefined8 *)__cxa_allocate_exception(8);
          *puVar13 = operator_new;
          __cxa_throw(puVar13,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
        }
        memset(pMVar10,0,__size);
        uVar16 = 1;
        uVar11 = 0;
        do {
          *(Index **)
           ((long)local_1f8.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
                  .m_data + uVar11 * 8) = (Index *)0x3ff0000000000000;
          local_1e8.m_data = (double *)0x0;
          local_1e8.m_rows = 0;
          Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                    ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_1e8,
                     local_1c0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                     m_storage.m_cols,1);
          uVar14 = local_1c0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                   m_storage.m_cols;
          if (local_1e8.m_rows !=
              local_1c0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
              m_cols) {
            Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                      ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_1e8,
                       local_1c0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                       m_storage.m_cols,1);
            uVar14 = local_1e8.m_rows;
          }
          if (0 < (long)uVar14) {
            memset(local_1e8.m_data,0,uVar14 << 3);
          }
          local_c8 = 1.0;
          if (local_1c0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
              m_cols == 1) {
            local_158 = (undefined1  [8])
                        local_1c0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                        m_storage.m_data;
            local_148.m_value =
                 local_1c0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 m_storage.m_rows;
            local_138.m_value = 0;
            sStack_130.m_other = 0.0;
            local_128.m_value =
                 local_1c0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 m_storage.m_rows;
            local_120.m_value =
                 (long)local_1f8.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                       m_storage.m_data;
            local_118.m_value =
                 local_1f8.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                 m_rows;
            local_108 = &local_1f8;
            local_100.m_value = 0;
            local_f0 = local_1f8.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                       m_storage.m_rows;
            local_140.m_matrix = &local_1c0;
            if (local_1f8.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                m_rows == 0) {
              dVar23 = 0.0;
            }
            else {
              local_c0.
              super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_true>_>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_true>_>_>
              .
              super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_true>_>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_true>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
              .m_d.lhsImpl.
              super_evaluator<Eigen::Transpose<const_Eigen::Block<const_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_true>_>_>
              .
              super_unary_evaluator<Eigen::Transpose<const_Eigen::Block<const_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_true>_>,_Eigen::internal::IndexBased,_double>
              .m_argImpl.
              super_evaluator<Eigen::Block<const_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_true>_>
              .
              super_block_evaluator<const_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_true,_true>
              .
              super_mapbase_evaluator<Eigen::Block<const_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_true>,_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>
              .m_data = local_1c0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                        m_storage.m_data;
              local_c0.
              super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_true>_>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_true>_>_>
              .
              super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_true>_>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_true>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
              .m_d.lhsImpl.
              super_evaluator<Eigen::Transpose<const_Eigen::Block<const_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_true>_>_>
              .
              super_unary_evaluator<Eigen::Transpose<const_Eigen::Block<const_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_true>_>,_Eigen::internal::IndexBased,_double>
              .m_argImpl.
              super_evaluator<Eigen::Block<const_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_true>_>
              .
              super_block_evaluator<const_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_true,_true>
              .
              super_mapbase_evaluator<Eigen::Block<const_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_true>,_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>
              .m_outerStride.m_value =
                   local_1c0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                   m_storage.m_rows;
              local_c0.
              super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_true>_>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_true>_>_>
              .
              super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_true>_>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_true>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
              .m_d.rhsImpl.
              super_evaluator<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_true>_>
              .
              super_block_evaluator<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_true,_true>
              .
              super_mapbase_evaluator<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_true>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
              .m_data = local_1f8.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                        m_storage.m_data;
              local_c0.
              super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_true>_>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_true>_>_>
              .
              super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_true>_>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_true>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
              .m_d.rhsImpl.
              super_evaluator<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_true>_>
              .
              super_block_evaluator<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_true,_true>
              .
              super_mapbase_evaluator<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_true>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
              .m_outerStride.m_value =
                   local_1f8.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                   m_storage.m_rows;
              dVar23 = Eigen::internal::
                       redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,double>,Eigen::Transpose<Eigen::Block<Eigen::Transpose<Eigen::Matrix<double,-1,-1,0,-1,-1>>const,1,-1,true>const>const,Eigen::Block<Eigen::Matrix<double,-1,1,0,-1,1>const,-1,1,true>const>>,3,0>
                       ::
                       run<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,double>,Eigen::Transpose<Eigen::Block<Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>const,1,_1,true>const>const,Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,_1,1,true>const>>
                                 (&local_c0,&local_1f9,
                                  (CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_true>_>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_true>_>
                                   *)local_158);
            }
            *local_1e8.m_data = (double)(dVar23 + (double)*local_1e8.m_data);
          }
          else {
            local_158 = (undefined1  [8])&local_1c0;
            Eigen::internal::gemv_dense_selector<2,1,true>::
            run<Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>,Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Matrix<double,_1,1,0,_1,1>>
                      ((Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_158,&local_1f8,
                       (Matrix<double,__1,_1,_0,__1,_1> *)&local_1e8,&local_c8);
          }
          local_c0.
          super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_true>_>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_true>_>_>
          .
          super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_true>_>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_true>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
          .m_d._0_8_ = &local_1e8;
          if (local_1e8.m_rows == 0) {
            SVar24 = 0.0;
          }
          else {
            eStack_150.m_d.data =
                 (plainobjectbase_evaluator_data<double,_0>)
                 (plainobjectbase_evaluator_data<double,_0>)local_1e8.m_data;
            SVar24 = Eigen::internal::
                     redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::Matrix<double,-1,1,0,-1,1>const>>,3,0>
                     ::
                     run<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>>
                               ((redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                 *)local_158,(scalar_sum_op<double,_double> *)&local_c8,
                                (CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                 *)&local_c0);
          }
          *(Scalar *)((long)__ptr + uVar11 * 8) = SVar24;
          *(Index **)
           ((long)local_1f8.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
                  .m_data + uVar11 * 8) = (Index *)0x0;
          free(local_1e8.m_data);
          uVar11 = (ulong)uVar16;
          uVar16 = uVar16 + 1;
          pvVar20 = local_190;
        } while ((long)uVar11 <
                 local_1a8.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                 m_rows);
      }
      pdVar1 = local_1f8.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
               m_data;
      free(__ptr);
      free(pdVar1);
      free(local_218.m_data);
      free(local_1a8.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
          );
      free(local_88.m_data);
      uVar16 = (int)local_d8 + 1;
      local_d8 = (ulong)uVar16;
      local_180 = (ulong)CONCAT31((int3)(uVar16 >> 8),uVar16 < max_iter);
    } while (uVar16 != max_iter);
  }
  free(local_1d8.m_data);
  free(local_1c0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data);
  return (bool)((byte)local_180 & 1);
}

Assistant:

RBDL_DLLAPI bool InverseKinematics (
    Model &model,
    const VectorNd &Qinit,
    const std::vector<unsigned int>& body_id,
    const std::vector<Vector3d>& body_point,
    const std::vector<Vector3d>& target_pos,
    VectorNd &Qres,
    double step_tol,
    double lambda,
    unsigned int max_iter) {
  assert (Qinit.size() == model.q_size);
  assert (body_id.size() == body_point.size());
  assert (body_id.size() == target_pos.size());

  MatrixNd J = MatrixNd::Zero(3 * body_id.size(), model.qdot_size);
  VectorNd e = VectorNd::Zero(3 * body_id.size());

  Qres = Qinit;

  for (unsigned int ik_iter = 0; ik_iter < max_iter; ik_iter++) {
    UpdateKinematicsCustom (model, &Qres, NULL, NULL);

    for (unsigned int k = 0; k < body_id.size(); k++) {
      MatrixNd G (MatrixNd::Zero(3, model.qdot_size));
      CalcPointJacobian (model, Qres, body_id[k], body_point[k], G, false);
      Vector3d point_base = 
        CalcBodyToBaseCoordinates (model, Qres, body_id[k], body_point[k], false);
      LOG << "current_pos = " << point_base.transpose() << std::endl;

      for (unsigned int i = 0; i < 3; i++) {
        for (unsigned int j = 0; j < model.qdot_size; j++) {
          unsigned int row = k * 3 + i;
          LOG << "i = " << i << " j = " << j << " k = " << k << " row = " 
            << row << " col = " << j << std::endl;
          J(row, j) = G (i,j);
        }

        e[k * 3 + i] = target_pos[k][i] - point_base[i];
      }
    }

    LOG << "J = " << J << std::endl;
    LOG << "e = " << e.transpose() << std::endl;

    // abort if we are getting "close"
    if (e.norm() < step_tol) {
      LOG << "Reached target close enough after " << ik_iter << " steps" << std::endl;
      return true;
    }

    MatrixNd JJTe_lambda2_I = 
      J * J.transpose() 
      + lambda*lambda * MatrixNd::Identity(e.size(), e.size());

    VectorNd z (body_id.size() * 3);

    bool solve_successful = LinSolveGaussElimPivot (JJTe_lambda2_I, e, z);
    assert (solve_successful);

    LOG << "z = " << z << std::endl;

    VectorNd delta_theta = J.transpose() * z;
    LOG << "change = " << delta_theta << std::endl;

    Qres = Qres + delta_theta;
    LOG << "Qres = " << Qres.transpose() << std::endl;

    if (delta_theta.norm() < step_tol) {
      LOG << "reached convergence after " << ik_iter << " steps" << std::endl;
      return true;
    }

    VectorNd test_1 (z.size());
    VectorNd test_res (z.size());

    test_1.setZero();

    for (unsigned int i = 0; i < z.size(); i++) {
      test_1[i] = 1.;

      VectorNd test_delta = J.transpose() * test_1;

      test_res[i] = test_delta.squaredNorm();

      test_1[i] = 0.;
    }

    LOG << "test_res = " << test_res.transpose() << std::endl;
  }

  return false;
}